

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O2

void uv::TCPClient::AfterSend(uv_write_t *req,int status)

{
  char *pcVar1;
  TCPClient *this;
  FILE *__stream;
  CStringStream *pCVar2;
  ILog4zManager *pIVar3;
  long *in_FS_OFFSET;
  CStringStream ss;
  string local_40;
  
  this = (TCPClient *)req->data;
  if (-1 < status) {
    send_inl(this,req);
    return;
  }
  if ((this->writeparam_list_).
      super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl._M_node.
      _M_size < 0x15) {
    ss.m_pBegin = (char *)req;
    std::__cxx11::list<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>::push_back
              (&this->writeparam_list_,(value_type *)&ss);
  }
  else {
    FreeWriteParam((write_param *)req);
  }
  ss.m_pEnd = (char *)*in_FS_OFFSET;
  pcVar1 = ss.m_pEnd + -0x800;
  ss.m_pBegin = pcVar1;
  ss.m_pCur = pcVar1;
  pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss,"send error:");
  GetUVError_abi_cxx11_(&local_40,status);
  zsummer::log4z::CStringStream::operator<<(pCVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pCVar2 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
  pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ");
  pCVar2 = zsummer::log4z::CStringStream::operator<<(pCVar2," ) : ");
  zsummer::log4z::CStringStream::operator<<(pCVar2,0x187);
  pIVar3 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar3->_vptr_ILog4zManager[8])(pIVar3,0,3,pcVar1);
  __stream = _stderr;
  GetUVError_abi_cxx11_((string *)&ss,status);
  fprintf(__stream,"send error %s\n",ss.m_pBegin);
  std::__cxx11::string::~string((string *)&ss);
  return;
}

Assistant:

void TCPClient::AfterSend(uv_write_t* req, int status)
{
    TCPClient* theclass = (TCPClient*)req->data;
    if (status < 0) {
        if (theclass->writeparam_list_.size() > MAXLISTSIZE) {
            FreeWriteParam((write_param*)req);
        } else {
            theclass->writeparam_list_.push_back((write_param*)req);
        }
        LOGE("send error:" << GetUVError(status));
        fprintf(stderr, "send error %s\n", GetUVError(status).c_str());
        return;
    }
    theclass->send_inl(req);
}